

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profile.cpp
# Opt level: O2

void __thiscall Profile::__displayBacktraceStaticMap(Profile *this)

{
  bool bVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Self __tmp;
  shared_ptr<DynFuncCall> value;
  string key;
  __shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50 [32];
  
  if (DebugFlag) {
    bVar1 = isCurrentDebugType("info");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"__displayBacktraceStaticMap");
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x10c);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  for (p_Var3 = (this->__backtraceStaticMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->__backtraceStaticMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string(local_50,(string *)(p_Var3 + 1));
    std::__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,(__shared_ptr<DynFuncCall,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 2));
    poVar2 = operator<<((ostream *)&std::cerr,local_60._M_ptr);
    std::endl<char,std::char_traits<char>>(poVar2);
    if (DebugFlag == true) {
      bVar1 = isCurrentDebugType("info");
      if (bVar1) {
        poVar2 = operator<<((ostream *)&std::cerr,local_60._M_ptr);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void Profile::__displayBacktraceStaticMap(){
    DEBUG("info",cerr << __FUNCTION__ << ":" << __LINE__<< endl;);
    for (auto it = __backtraceStaticMap.begin(); it != __backtraceStaticMap.end(); it++){
        string key = it->first;
        shared_ptr<DynFuncCall>value = it->second;
        cerr << *value << endl;
        DEBUG("info",cerr << *value << endl;);
    }
}